

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_3dVector * __thiscall
ON_3dVector::operator*(ON_3dVector *__return_storage_ptr__,ON_3dVector *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = this->x;
  dVar2 = this->y;
  dVar3 = this->z;
  ON_3dVector(__return_storage_ptr__,
              xform->m_xform[2][0] * dVar3 +
              xform->m_xform[0][0] * dVar1 + xform->m_xform[1][0] * dVar2,
              xform->m_xform[2][1] * dVar3 +
              xform->m_xform[0][1] * dVar1 + xform->m_xform[1][1] * dVar2,
              dVar3 * xform->m_xform[2][2] +
              dVar1 * xform->m_xform[0][2] + dVar2 * xform->m_xform[1][2]);
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_3dVector::operator*( const ON_Xform& xform ) const
{
  const double vx = x; // optimizer should put vx,vy,vz in registers
  const double vy = y;
  const double vz = z;
  double hx[3];
  const double* m = &xform.m_xform[0][0];
  hx[0] = m[0]*vx + m[4]*vy + m[ 8]*vz;
  hx[1] = m[1]*vx + m[5]*vy + m[ 9]*vz;
  hx[2] = m[2]*vx + m[6]*vy + m[10]*vz;
  return ON_3dVector( hx[0],hx[1],hx[2] );
}